

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O2

void __thiscall proto3_arena_unittest::TestAllTypes::Clear(TestAllTypes *this)

{
  uint uVar1;
  TestAllTypes_NestedMessage *pTVar2;
  ForeignMessage *this_00;
  ImportMessage *pIVar3;
  PublicImportMessage *this_01;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_int64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_uint32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.repeated_uint64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_sint32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_sint64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_fixed32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.repeated_fixed64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_sfixed32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_sfixed64_);
  google::protobuf::RepeatedField<float>::Clear(&(this->field_0)._impl_.repeated_float_);
  google::protobuf::RepeatedField<double>::Clear(&(this->field_0)._impl_.repeated_double_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.repeated_bool_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::TestAllTypes_NestedMessage>>
            (&(this->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::ForeignMessage>>
            (&(this->field_0)._impl_.repeated_foreign_message_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
            (&(this->field_0)._impl_.repeated_import_message_.super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_nested_enum_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_foreign_enum_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string_piece_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_cord_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::TestAllTypes_NestedMessage>>
            (&(this->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase);
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_);
    }
    if ((uVar1 & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_bytes_);
    }
    if ((uVar1 & 4) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_piece_);
    }
    if ((uVar1 & 8) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_cord_);
    }
    if ((uVar1 & 0x10) != 0) {
      pTVar2 = (this->field_0)._impl_.optional_nested_message_;
      if (pTVar2 == (TestAllTypes_NestedMessage *)0x0) {
        failure_msg = "_impl_.optional_nested_message_ != nullptr";
        line = 0x6e5;
        goto LAB_00a71ce2;
      }
      proto3_arena_unittest::TestAllTypes_NestedMessage::Clear(pTVar2);
    }
    if ((uVar1 & 0x20) != 0) {
      this_00 = (this->field_0)._impl_.optional_foreign_message_;
      if (this_00 == (ForeignMessage *)0x0) {
        failure_msg = "_impl_.optional_foreign_message_ != nullptr";
        line = 0x6e9;
        goto LAB_00a71ce2;
      }
      proto3_arena_unittest::ForeignMessage::Clear(this_00);
    }
    if ((uVar1 & 0x40) != 0) {
      pIVar3 = (this->field_0)._impl_.optional_import_message_;
      if (pIVar3 == (ImportMessage *)0x0) {
        failure_msg = "_impl_.optional_import_message_ != nullptr";
        line = 0x6ed;
        goto LAB_00a71ce2;
      }
      proto2_unittest_import::ImportMessage::Clear(pIVar3);
    }
    if ((char)uVar1 < '\0') {
      this_01 = (this->field_0)._impl_.optional_public_import_message_;
      if (this_01 == (PublicImportMessage *)0x0) {
        failure_msg = "_impl_.optional_public_import_message_ != nullptr";
        line = 0x6f1;
        goto LAB_00a71ce2;
      }
      proto2_unittest_import::PublicImportMessage::Clear(this_01);
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      pTVar2 = (this->field_0)._impl_.optional_lazy_message_;
      if (pTVar2 == (TestAllTypes_NestedMessage *)0x0) {
        failure_msg = "_impl_.optional_lazy_message_ != nullptr";
        line = 0x6f7;
        goto LAB_00a71ce2;
      }
      proto3_arena_unittest::TestAllTypes_NestedMessage::Clear(pTVar2);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      pTVar2 = (this->field_0)._impl_.optional_unverified_lazy_message_;
      if (pTVar2 == (TestAllTypes_NestedMessage *)0x0) {
        failure_msg = "_impl_.optional_unverified_lazy_message_ != nullptr";
        line = 0x6fb;
        goto LAB_00a71ce2;
      }
      proto3_arena_unittest::TestAllTypes_NestedMessage::Clear(pTVar2);
    }
  }
  if ((uVar1 & 0xfc00) != 0) {
    (this->field_0)._impl_.optional_uint64_ = 0;
    (this->field_0)._impl_.optional_sint64_ = 0;
    (this->field_0)._impl_.optional_int64_ = 0;
    *(undefined8 *)((long)&this->field_0 + 600) = 0;
    (this->field_0)._impl_.optional_sint32_ = 0;
  }
  if ((uVar1 & 0xff0000) != 0) {
    (this->field_0)._impl_.optional_double_ = 0.0;
    *(undefined8 *)((long)&this->field_0 + 0x298) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.optional_sfixed64_ + 4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28c) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x274) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.optional_fixed64_ + 4) = 0;
  }
  if ((uVar1 & 0x3f000000) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x2a0) = 0;
    if ((uVar1 >> 0x1a & 1) != 0) {
      absl::lts_20250127::Cord::Clear(&(this->field_0)._impl_.optional_bytes_cord_);
    }
    if ((uVar1 >> 0x1b & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.proto3_optional_string_);
    }
    if ((uVar1 >> 0x1c & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.proto3_optional_bytes_);
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      pIVar3 = (this->field_0)._impl_.optional_lazy_import_message_;
      if (pIVar3 == (ImportMessage *)0x0) {
        failure_msg = "_impl_.optional_lazy_import_message_ != nullptr";
        line = 0x717;
LAB_00a71ce2:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      proto2_unittest_import::ImportMessage::Clear(pIVar3);
    }
  }
  if (0x3fffffff < uVar1) {
    (this->field_0)._impl_.proto3_optional_int32_ = 0;
    (this->field_0)._impl_.proto3_optional_int64_ = 0;
  }
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  if ((char)uVar1 != '\0') {
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_fixed64_ + 4) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_sfixed64_ + 4) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_sint64_ + 4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2f4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2dc) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_uint64_ + 4) = 0;
  }
  if ((uVar1 & 0x300) != 0) {
    *(undefined4 *)((long)&this->field_0 + 0x314) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x30c) = 0;
  }
  clear_oneof_field(this);
  *(undefined8 *)(this->field_0)._impl_._has_bits_.has_bits_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_int32_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_uint32_.Clear();
  _impl_.repeated_uint64_.Clear();
  _impl_.repeated_sint32_.Clear();
  _impl_.repeated_sint64_.Clear();
  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_sfixed32_.Clear();
  _impl_.repeated_sfixed64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_double_.Clear();
  _impl_.repeated_bool_.Clear();
  _impl_.repeated_string_.Clear();
  _impl_.repeated_bytes_.Clear();
  _impl_.repeated_nested_message_.Clear();
  _impl_.repeated_foreign_message_.Clear();
  _impl_.repeated_import_message_.Clear();
  _impl_.repeated_nested_enum_.Clear();
  _impl_.repeated_foreign_enum_.Clear();
  _impl_.repeated_string_piece_.Clear();
  _impl_.repeated_cord_.Clear();
  _impl_.repeated_lazy_message_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.optional_string_piece_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.optional_cord_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.optional_nested_message_ != nullptr);
      _impl_.optional_nested_message_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.optional_foreign_message_ != nullptr);
      _impl_.optional_foreign_message_->Clear();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(_impl_.optional_import_message_ != nullptr);
      _impl_.optional_import_message_->Clear();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(_impl_.optional_public_import_message_ != nullptr);
      _impl_.optional_public_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_message_ != nullptr);
      _impl_.optional_lazy_message_->Clear();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(_impl_.optional_unverified_lazy_message_ != nullptr);
      _impl_.optional_unverified_lazy_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000fc00u) != 0) {
    ::memset(&_impl_.optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_sint32_) -
        reinterpret_cast<char*>(&_impl_.optional_int64_)) + sizeof(_impl_.optional_sint32_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.optional_fixed32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_nested_enum_) -
        reinterpret_cast<char*>(&_impl_.optional_fixed32_)) + sizeof(_impl_.optional_nested_enum_));
  }
  if ((cached_has_bits & 0x3f000000u) != 0) {
    ::memset(&_impl_.optional_foreign_enum_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_float_) -
        reinterpret_cast<char*>(&_impl_.optional_foreign_enum_)) + sizeof(_impl_.proto3_optional_float_));
    if ((cached_has_bits & 0x04000000u) != 0) {
      _impl_.optional_bytes_cord_.Clear();
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _impl_.proto3_optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _impl_.proto3_optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_import_message_ != nullptr);
      _impl_.optional_lazy_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0xc0000000u) != 0) {
    ::memset(&_impl_.proto3_optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_int32_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_int64_)) + sizeof(_impl_.proto3_optional_int32_));
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.proto3_optional_uint32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_sfixed32_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_uint32_)) + sizeof(_impl_.proto3_optional_sfixed32_));
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    ::memset(&_impl_.proto3_optional_bool_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_double_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_bool_)) + sizeof(_impl_.proto3_optional_double_));
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}